

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase41::run(TestCase41 *this)

{
  undefined4 uVar1;
  bool bVar2;
  Schema SVar3;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StructSchema schema;
  Fault f;
  uint local_260;
  uint local_25c;
  Field field;
  Field lookup;
  undefined1 local_1d0 [40];
  WirePointer *pWStack_1a8;
  NullableValue<kj::Exception> local_198;
  
  schema.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto((Reader *)&local_198,&schema.super_Schema);
  if ((((uint)local_198.field_1._24_4_ < 0x40) ||
      (*(long *)local_198.field_1.value.ownFile.content.size_ != -0x5f570ceb47f49c03)) &&
     (kj::_::Debug::minSeverity < 3)) {
    field.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0xa0a8f314b80b63fd;
    Schema::getProto((Reader *)&local_198,&schema.super_Schema);
    if ((uint)local_198.field_1._24_4_ < 0x40) {
      lookup.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    }
    else {
      lookup.parent.super_Schema.raw = *(Schema *)local_198.field_1.value.ownFile.content.size_;
    }
    kj::_::Debug::log<char_const(&)[73],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(typeId<TestAllTypes>()) == (schema.getProto().getId())\", typeId<TestAllTypes>(), schema.getProto().getId()"
               ,(char (*) [73])
                "failed: expected (typeId<TestAllTypes>()) == (schema.getProto().getId())",
               (unsigned_long *)&field,(unsigned_long *)&lookup);
  }
  SVar3 = Schema::getDependency(&schema.super_Schema,0x9c8e9318b29d9cd3);
  if ((SVar3.raw != (RawBrandedSchema *)(schemas::s_9c8e9318b29d9cd3 + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[86]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2e,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()\""
               ,(char (*) [86])
                "failed: expected schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()"
              );
  }
  SVar3 = Schema::getDependency(&schema.super_Schema,0x9c8e9318b29d9cd3);
  if (((Schema)SVar3.raw == schema.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[68]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x2f,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) != schema\"",
               (char (*) [68])"failed: expected schema.getDependency(typeId<TestEnum>()) != schema")
    ;
  }
  SVar3 = Schema::getDependency(&schema.super_Schema,0xa0a8f314b80b63fd);
  if ((SVar3.raw != (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[94]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()\""
               ,(char (*) [94])
                "failed: expected schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()"
              );
  }
  SVar3 = Schema::getDependency(&schema.super_Schema,0xa0a8f314b80b63fd);
  if (((Schema)SVar3.raw != schema.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x31,ERROR,
               "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == schema\"",
               (char (*) [72])
               "failed: expected schema.getDependency(typeId<TestAllTypes>()) == schema");
  }
  field.parent.super_Schema.raw = (Schema)&PTR_run_0065ac38;
  field._8_8_ = &schema.super_Schema;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_198,(Runnable *)&field);
  bVar2 = local_198.isSet;
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_198);
  if ((bVar2 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[111]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x32,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != nullptr\""
               ,(char (*) [111])
                "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != nullptr"
              );
  }
  SVar3.raw = (RawBrandedSchema *)Schema::asStruct(&schema.super_Schema);
  if (((Schema)SVar3.raw != schema.super_Schema.raw) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x34,ERROR,"\"failed: expected \" \"schema.asStruct() == schema\"",
               (char (*) [45])"failed: expected schema.asStruct() == schema");
  }
  field.parent.super_Schema.raw = (Schema)&PTR_run_0065ac68;
  field._8_8_ = &schema.super_Schema;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_198,(Runnable *)&field);
  bVar2 = local_198.isSet;
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_198);
  if ((bVar2 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asEnum(); }) != nullptr\""
               ,(char (*) [82])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asEnum(); }) != nullptr")
    ;
  }
  field.parent.super_Schema.raw = (Schema)&PTR_run_0065ac98;
  field._8_8_ = &schema.super_Schema;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_198,(Runnable *)&field);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_198);
  if ((local_198.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[87]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x36,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asInterface(); }) != nullptr\""
               ,(char (*) [87])
                "failed: expected kj::runCatchingExceptions([&]() { schema.asInterface(); }) != nullptr"
              );
  }
  StructSchema::getFields((FieldList *)&local_198,(StructSchema *)&schema.super_Schema);
  uVar1 = local_198.field_1._24_4_;
  Schema::getProto((Reader *)local_1d0,&schema.super_Schema);
  lookup.proto._reader.data = (void *)local_1d0._32_8_;
  lookup.proto._reader.pointers = pWStack_1a8;
  lookup.proto._reader.segment = (SegmentReader *)local_1d0._16_8_;
  lookup.proto._reader.capTable = (CapTableReader *)local_1d0._24_8_;
  capnp::schema::Node::Struct::Reader::getFields((Reader *)&field,(Reader *)&lookup);
  if (uVar1 == (uint)field.proto._reader.capTable) {
    StructSchema::getFields((FieldList *)&local_198,&schema);
    StructSchema::FieldList::operator[](&field,(FieldList *)&local_198,0);
    local_198.field_1._0_4_ = (uint)field.proto._reader.capTable;
    local_198.field_1.value.file = (char *)field.proto._reader._32_8_;
    local_198.field_1._32_8_ = field.proto._reader._40_8_;
    local_198.field_1.value.ownFile.content.size_ = (size_t)field.proto._reader.data;
    local_198.field_1.value.ownFile.content.disposer = (ArrayDisposer *)field.proto._reader.pointers
    ;
    local_198._0_8_ = field.proto._reader.segment;
    lookup._0_16_ = capnp::schema::Field::Reader::getName((Reader *)&local_198);
    bVar2 = kj::operator==("voidField",(StringPtr *)&lookup);
    if (kj::_::Debug::minSeverity < 3 && !bVar2) {
      local_198.field_1._0_4_ = (uint)field.proto._reader.capTable;
      local_198.field_1.value.file = (char *)field.proto._reader._32_8_;
      local_198.field_1._32_8_ = field.proto._reader._40_8_;
      local_198.field_1.value.ownFile.content.size_ = (size_t)field.proto._reader.data;
      local_198.field_1.value.ownFile.content.disposer =
           (ArrayDisposer *)field.proto._reader.pointers;
      local_198._0_8_ = field.proto._reader.segment;
      lookup._0_16_ = capnp::schema::Field::Reader::getName((Reader *)&local_198);
      kj::_::Debug::log<char_const(&)[63],char_const(&)[10],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3a,ERROR,
                 "\"failed: expected \" \"(\\\"voidField\\\") == (field.getProto().getName())\", \"voidField\", field.getProto().getName()"
                 ,(char (*) [63])"failed: expected (\"voidField\") == (field.getProto().getName())",
                 (char (*) [10])"voidField",(Reader *)&lookup);
    }
    if ((field.parent.super_Schema.raw != schema.super_Schema.raw) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3b,ERROR,"\"failed: expected \" \"field.getContainingStruct() == schema\"",
                 (char (*) [55])"failed: expected field.getContainingStruct() == schema");
    }
    name.content.size_ = 10;
    name.content.ptr = "voidField";
    StructSchema::getFieldByName(&lookup,&schema,name);
    if ((lookup.index != field.index ||
         lookup.parent.super_Schema.raw != field.parent.super_Schema.raw) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3e,ERROR,"\"failed: expected \" \"lookup == field\"",
                 (char (*) [33])"failed: expected lookup == field");
    }
    StructSchema::getFields((FieldList *)local_1d0,&schema);
    StructSchema::FieldList::operator[]((Field *)&local_198,(FieldList *)local_1d0,1);
    if (((lookup.parent.super_Schema.raw == (Schema)local_198._0_8_) &&
        (lookup.index == local_198.field_1._0_4_)) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x3f,ERROR,"\"failed: expected \" \"lookup != schema.getFields()[1]\"",
                 (char (*) [49])"failed: expected lookup != schema.getFields()[1]");
    }
    if (((0x80 < lookup.proto._reader.dataSize) &&
        ((*(byte *)((long)lookup.proto._reader.data + 0x10) & 1) != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[72]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"!(lookup.getProto().getSlot().getHadExplicitDefault())\"",
                 (char (*) [72])
                 "failed: expected !(lookup.getProto().getSlot().getHadExplicitDefault())");
    }
    name_00.content.size_ = 0xb;
    name_00.content.ptr = "int32Field";
    StructSchema::getFieldByName((Field *)&local_198,&schema,name_00);
    if (((0x80 < (uint)local_198.field_1._40_4_) && ((local_198.field_1.value.file[0x10] & 1U) != 0)
        ) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[101]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"!(schema.getFieldByName(\\\"int32Field\\\").getProto().getSlot().getHadExplicitDefault())\""
                 ,(char (*) [101])
                  "failed: expected !(schema.getFieldByName(\"int32Field\").getProto().getSlot().getHadExplicitDefault())"
                );
    }
    local_1d0._0_8_ = (long)schemas::s_eb3f9ebe98c73cb6 + 0x48;
    name_01.content.size_ = 0xb;
    name_01.content.ptr = "int32Field";
    StructSchema::getFieldByName((Field *)&local_198,(StructSchema *)local_1d0,name_01);
    if ((((uint)local_198.field_1._40_4_ < 0x81) || ((local_198.field_1.value.file[0x10] & 1U) == 0)
        ) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[121]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x45,ERROR,
                 "\"failed: expected \" \"Schema::from<TestDefaults>().getFieldByName(\\\"int32Field\\\") .getProto().getSlot().getHadExplicitDefault()\""
                 ,(char (*) [121])
                  "failed: expected Schema::from<TestDefaults>().getFieldByName(\"int32Field\") .getProto().getSlot().getHadExplicitDefault()"
                );
    }
    name_02.content.size_ = 0xc;
    name_02.content.ptr = "noSuchField";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_198,&schema,name_02);
    if ((local_198.isSet == true) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x47,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"noSuchField\\\") == nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"noSuchField\") == nullptr");
    }
    name_03.content.size_ = 0xb;
    name_03.content.ptr = "int32Field";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_198,&schema,name_03);
    if ((local_198.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x49,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"int32Field\\\") != nullptr\"",
                 (char (*) [65])"failed: expected schema.findFieldByName(\"int32Field\") != nullptr"
                );
    }
    name_04.content.size_ = 0xc;
    name_04.content.ptr = "float32List";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_198,&schema,name_04);
    if ((local_198.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4a,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"float32List\\\") != nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"float32List\") != nullptr");
    }
    name_05.content.size_ = 9;
    name_05.content.ptr = "dataList";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_198,&schema,name_05);
    if ((local_198.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4b,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"dataList\\\") != nullptr\"",
                 (char (*) [63])"failed: expected schema.findFieldByName(\"dataList\") != nullptr");
    }
    name_06.content.size_ = 10;
    name_06.content.ptr = "textField";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_198,&schema,name_06);
    if ((local_198.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[64]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4c,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"textField\\\") != nullptr\"",
                 (char (*) [64])"failed: expected schema.findFieldByName(\"textField\") != nullptr")
      ;
    }
    name_07.content.size_ = 0xc;
    name_07.content.ptr = "structField";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_198,&schema,name_07);
    if ((local_198.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x4d,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"structField\\\") != nullptr\"",
                 (char (*) [66])
                 "failed: expected schema.findFieldByName(\"structField\") != nullptr");
    }
    return;
  }
  StructSchema::getFields((FieldList *)&local_198,(StructSchema *)&schema.super_Schema);
  local_25c = local_198.field_1._24_4_;
  Schema::getProto((Reader *)local_1d0,&schema.super_Schema);
  lookup.proto._reader.data = (void *)local_1d0._32_8_;
  lookup.proto._reader.pointers = pWStack_1a8;
  lookup.proto._reader.segment = (SegmentReader *)local_1d0._16_8_;
  lookup.proto._reader.capTable = (CapTableReader *)local_1d0._24_8_;
  capnp::schema::Node::Struct::Reader::getFields((Reader *)&field,(Reader *)&lookup);
  local_260 = (uint)field.proto._reader.capTable;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
             ,0x38,FAILED,
             "(schema.getFields().size()) == (schema.getProto().getStruct().getFields().size())",
             "schema.getFields().size(), schema.getProto().getStruct().getFields().size()",
             &local_25c,&local_260);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Schema, Structs) {
  StructSchema schema = Schema::from<TestAllTypes>();

  EXPECT_EQ(typeId<TestAllTypes>(), schema.getProto().getId());

  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>());
  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) != schema);
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>());
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == schema);
  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestDefaults>()));

  EXPECT_TRUE(schema.asStruct() == schema);
  EXPECT_NONFATAL_FAILURE(schema.asEnum());
  EXPECT_NONFATAL_FAILURE(schema.asInterface());

  ASSERT_EQ(schema.getFields().size(), schema.getProto().getStruct().getFields().size());
  StructSchema::Field field = schema.getFields()[0];
  EXPECT_EQ("voidField", field.getProto().getName());
  EXPECT_TRUE(field.getContainingStruct() == schema);

  StructSchema::Field lookup = schema.getFieldByName("voidField");
  EXPECT_TRUE(lookup == field);
  EXPECT_TRUE(lookup != schema.getFields()[1]);
  EXPECT_FALSE(lookup.getProto().getSlot().getHadExplicitDefault());

  EXPECT_FALSE(schema.getFieldByName("int32Field").getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(Schema::from<TestDefaults>().getFieldByName("int32Field")
      .getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(schema.findFieldByName("noSuchField") == nullptr);

  EXPECT_TRUE(schema.findFieldByName("int32Field") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("float32List") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("dataList") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("textField") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("structField") != nullptr);
}